

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool ON_BrepRemoveSlits(ON_BrepFace *F)

{
  bool bVar1;
  int iVar2;
  ON_Brep *pOVar3;
  int *piVar4;
  ON_BrepLoop *L_00;
  ON_BrepLoop *L;
  int i;
  int loop_count;
  bool rc;
  ON_Brep *pB;
  ON_BrepFace *F_local;
  
  if (F->m_face_index < 0) {
    F_local._7_1_ = false;
  }
  else {
    pOVar3 = ON_BrepFace::Brep(F);
    if (pOVar3 == (ON_Brep *)0x0) {
      F_local._7_1_ = false;
    }
    else {
      F_local._7_1_ = false;
      iVar2 = ON_SimpleArray<int>::Count(&F->m_li);
      for (L._4_4_ = 0; L._4_4_ < iVar2; L._4_4_ = L._4_4_ + 1) {
        piVar4 = ON_SimpleArray<int>::operator[](&F->m_li,L._4_4_);
        L_00 = ON_ClassArray<ON_BrepLoop>::operator[]
                         ((ON_ClassArray<ON_BrepLoop> *)&pOVar3->m_L,*piVar4);
        if ((-1 < L_00->m_loop_index) && (bVar1 = ON_BrepRemoveSlits(L_00), bVar1)) {
          F_local._7_1_ = true;
        }
      }
    }
  }
  return F_local._7_1_;
}

Assistant:

bool ON_BrepRemoveSlits(ON_BrepFace& F)

{
  //For each loop, look for slit pairs that fall between non slits and 
  //break the loop at the pair.
  //After all loops have been split, call ON_Brep::RemoveSlits() on the result.

  if (F.m_face_index < 0)
    return false;
  ON_Brep* pB = F.Brep();
  if (!pB)
    return false;
  bool rc = false;
  int loop_count = F.m_li.Count();
  int i;
  for (i=0; i<loop_count; i++){
    ON_BrepLoop& L = pB->m_L[F.m_li[i]];
    if (L.m_loop_index < 0)
      continue;
    if (ON_BrepRemoveSlits(L))
      rc = true;
  }
  return rc;
}